

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

void __thiscall Assimp::FBX::MeshGeometry::~MeshGeometry(MeshGeometry *this)

{
  long lVar1;
  
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__MeshGeometry_00821880;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_mappings).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_mapping_offsets).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_mapping_counts).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  lVar1 = 0x368;
  do {
    std::_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~_Vector_base
              ((_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
               ((long)&(this->super_Geometry).super_Object._vptr_Object + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0x2a8);
  lVar1 = 0x2a8;
  do {
    std::_Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::~_Vector_base
              ((_Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
               ((long)&(this->super_Geometry).super_Object._vptr_Object + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0x1e8);
  lVar1 = 0x1e0;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&(this->super_Geometry).super_Object._vptr_Object + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != 0xe0);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->m_normals).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->m_binormals).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->m_tangents).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_facesVertexStartIndices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->m_vertices).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_materials).super__Vector_base<int,_std::allocator<int>_>);
  Geometry::~Geometry(&this->super_Geometry);
  return;
}

Assistant:

MeshGeometry::~MeshGeometry() {
    // empty
}